

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCircle::IfcCircle(IfcCircle *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcCircle";
  IfcConic::IfcConic(&this->super_IfcConic,&PTR_construction_vtable_24__008be668);
  *(undefined8 *)&(this->super_IfcConic).field_0x58 = 0;
  (this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8be588;
  *(undefined8 *)&this->field_0x68 = 0x8be650;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8be5b0;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8be5d8;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 = 0x8be600
  ;
  *(undefined8 *)&(this->super_IfcConic).field_0x50 = 0x8be628;
  return;
}

Assistant:

IfcCircle() : Object("IfcCircle") {}